

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int luv_tcp_connect(lua_State *L)

{
  int iVar1;
  int iVar2;
  uv_tcp_t *handle;
  char *ip;
  ulong uVar3;
  uv_connect_t *req;
  luv_req_t *plVar4;
  int in_ESI;
  sockaddr_storage addr;
  sockaddr_in6 asStack_a8 [4];
  
  handle = luv_check_tcp(L,in_ESI);
  ip = luaL_checklstring(L,2,(size_t *)0x0);
  uVar3 = luaL_checkinteger(L,3);
  iVar1 = uv_ip4_addr(ip,(int)uVar3,(sockaddr_in *)asStack_a8);
  if ((iVar1 != 0) && (iVar1 = uv_ip6_addr(ip,(int)uVar3,asStack_a8), iVar1 != 0)) {
    iVar1 = luaL_error(L,"Invalid IP address or port [%s:%d]",ip,uVar3 & 0xffffffff);
    return iVar1;
  }
  iVar1 = luv_check_continuation(L,4);
  req = (uv_connect_t *)lua_newuserdata(L,0x60);
  plVar4 = luv_setup_req(L,iVar1);
  req->data = plVar4;
  iVar1 = uv_tcp_connect(req,handle,(sockaddr *)asStack_a8,luv_connect_cb);
  iVar2 = 1;
  if (iVar1 < 0) {
    luv_cleanup_req(L,(luv_req_t *)req->data);
    lua_settop(L,-2);
    luv_error(L,iVar1);
    iVar2 = 3;
  }
  return iVar2;
}

Assistant:

static int luv_tcp_connect(lua_State* L) {
  uv_tcp_t* handle = luv_check_tcp(L, 1);
  const char* host = luaL_checkstring(L, 2);
  int port = luaL_checkinteger(L, 3);
  struct sockaddr_storage addr;
  uv_connect_t* req;
  int ret, ref;
  luv_handle_t* lhandle = handle->data;
  if (uv_ip4_addr(host, port, (struct sockaddr_in*)&addr) &&
      uv_ip6_addr(host, port, (struct sockaddr_in6*)&addr)) {
    return luaL_error(L, "Invalid IP address or port [%s:%d]", host, port);
  }
  ref = luv_check_continuation(L, 4);

  req = (uv_connect_t*)lua_newuserdata(L, sizeof(*req));
  req->data = luv_setup_req(L, lhandle->ctx, ref);
  ret = uv_tcp_connect(req, handle, (struct sockaddr*)&addr, luv_connect_cb);
  if (ret < 0) {
    luv_cleanup_req(L, (luv_req_t*)req->data);
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  return 1;
}